

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printVar(JSPrinter *this,Ref node)

{
  uint uVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *s;
  uint uVar4;
  size_t i;
  ulong uVar5;
  Value *local_40;
  Ref node_local;
  Ref args;
  
  local_40 = node.inst;
  emit(this,"var ");
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_40);
  node_local.inst = (Value *)*puVar2;
  uVar5 = 0;
  while( true ) {
    sVar3 = Value::size(node_local.inst);
    if (sVar3 <= uVar5) break;
    if (uVar5 != 0) {
      if (this->pretty == true) {
        emit(this,", ");
      }
      else {
        emit(this,',');
      }
    }
    uVar4 = (uint)&node_local;
    uVar1 = cashew::Ref::operator[](uVar4);
    puVar2 = (undefined8 *)cashew::Ref::operator[](uVar1);
    s = Value::getCString((Value *)*puVar2);
    emit(this,s);
    puVar2 = (undefined8 *)cashew::Ref::operator[](uVar4);
    sVar3 = Value::size((Value *)*puVar2);
    if (1 < sVar3) {
      space(this);
      emit(this,'=');
      space(this);
      uVar1 = cashew::Ref::operator[](uVar4);
      puVar2 = (undefined8 *)cashew::Ref::operator[](uVar1);
      print(this,(Value *)*puVar2);
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void printVar(Ref node) {
    emit("var ");
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i][0]->getCString());
      if (args[i]->size() > 1) {
        space();
        emit('=');
        space();
        print(args[i][1]);
      }
    }
  }